

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_rotate(matrix3 *self,float angle)

{
  matrix3 rotationMatrix;
  matrix3 local_34;
  
  matrix3_make_transformation_rotationf_z(&local_34,angle);
  matrix3_multiply(self,&local_34);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_rotate(struct matrix3 *self, HYP_FLOAT angle)
{
	struct matrix3 rotationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_rotationf_z(&rotationMatrix, angle));
}